

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst.h
# Opt level: O3

void __thiscall mocker::nasm::Call::~Call(Call *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Inst)._vptr_Inst = (_func_int **)&PTR__Call_001e9848;
  pcVar2 = (this->funcName)._M_dataplus._M_p;
  paVar1 = &(this->funcName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit Call(std::string funcName) : funcName(std::move(funcName)) {}